

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::eval_context(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
               *this,allocator_type *alloc)

{
  (this->temp_node_values_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->temp_node_values_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->temp_node_values_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cache_)._M_h._M_buckets = &(this->cache_)._M_h._M_single_bucket;
  (this->cache_)._M_h._M_bucket_count = 1;
  (this->cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cache_)._M_h._M_element_count = 0;
  (this->cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->length_label_)._M_dataplus._M_p = (pointer)&(this->length_label_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->length_label_,"length","");
  return;
}

Assistant:

eval_context(const allocator_type& alloc = allocator_type())
            : alloc_(alloc), length_label_{JSONCONS_CSTRING_CONSTANT(char_type, "length"), alloc}
        {
        }